

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_sendReplyChunk
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  TadsServerThread *this_00;
  int iVar2;
  bodyArg *this_01;
  void *pvVar3;
  ssize_t sVar4;
  size_t __n;
  int in_R8D;
  long lVar5;
  long *in_FS_OFFSET;
  http_reply_err err;
  char lbuf [20];
  err_frame_t err_cur__;
  int local_138 [2];
  char *local_130;
  char local_128 [24];
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  if (oargc == (uint *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (long)(int)*oargc;
  }
  if (getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_sendReplyChunk();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_sendReplyChunk::desc);
  if (iVar2 == 0) {
    lVar1 = *(long *)(this->super_CVmObject).ext_;
    this_00 = *(TadsServerThread **)(lVar1 + 0x38);
    if (*(int *)(lVar1 + 0x30) != 0) {
      throw_net_err("request already completed",0);
    }
    this_01 = (bodyArg *)operator_new(0x58);
    bodyArg::bodyArg(this_01,0);
    G_err_frame::__tls_init();
    local_108 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_110;
    local_110[0] = _setjmp(&local_f8);
    if (local_110[0] == 0) {
      if (this_01->init_err != 0) {
        err_throw(this_01->init_err);
      }
      __n = (size_t)this_01->len;
      t3sprintf(local_128,0x14,"%lx\r\n");
      pvVar3 = (void *)strlen(local_128);
      sVar4 = TadsServerThread::send(this_00,(int)local_128,pvVar3,__n,in_R8D);
      if ((int)sVar4 == 0) {
        throw_net_err("error sending length prefix",(this_00->socket->super_OS_CoreSocket).err);
      }
      sVar4 = bodyArg::send(this_01,(int)this_00,local_138,__n,in_R8D);
      if ((int)sVar4 == 0) {
        throw_net_err(local_130,local_138[0]);
      }
      sVar4 = TadsServerThread::send(this_00,0x2cee49,(void *)0x2,__n,in_R8D);
      if ((int)sVar4 == 0) {
        throw_net_err("error sending suffix",(this_00->socket->super_OS_CoreSocket).err);
      }
    }
    if (-1 < (short)local_110[0]) {
      local_110[0] = local_110[0] | 0x8000;
      bodyArg::~bodyArg(this_01);
      operator_delete(this_01,0x58);
    }
    lVar1 = local_108;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_110[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_100;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_110[0] & 2) != 0) {
      free(local_100);
    }
    sp_ = sp_ + -lVar5;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_sendReplyChunk(VMG_ vm_obj_id_t self,
                                           vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request and thread */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* retrieve the 'body' argument */
    bodyArg *body = new bodyArg(vmg_ 0);

    err_try
    {
        /* make sure we initialized the body correctly */
        if (body->init_err != 0)
            err_throw(body->init_err);
        
        /* send the length prefix */
        char lbuf[20];
        t3sprintf(lbuf, sizeof(lbuf), "%lx\r\n", (long)body->len);
        if (!t->send(lbuf))
            throw_net_err(vmg_ "error sending length prefix", t->last_error());

        /* send the body */
        http_reply_err err;
        if (!body->send(t, &err))
            throw_net_err(vmg_ err.msg, err.sock_err);

        /* send the CR-LF suffix */
        if (!t->send("\r\n"))
            throw_net_err(vmg_ "error sending suffix", t->last_error());
    }